

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeLinkNetTotalWrenchDynEqFixedBase(BerdyHelper *this,LinkIndex idx)

{
  long lVar1;
  IndexRange IVar2;
  
  if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
    lVar1 = iDynTree::Traversal::getTraversalIndexFromLinkIndex((long)&this->m_dynamicsTraversal);
    IVar2.size = 6;
    IVar2.offset = lVar1 * 0x13 + -0xd;
  }
  else {
    IVar2 = (IndexRange)iDynTree::IndexRange::InvalidRange();
  }
  return IVar2;
}

Assistant:

IndexRange BerdyHelper::getRangeLinkNetTotalWrenchDynEqFixedBase(const LinkIndex idx) const
{
    IndexRange ret;

    if( m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE )
    {
        TraversalIndex trvIdx = m_dynamicsTraversal.getTraversalIndexFromLinkIndex(idx);
        ret.offset = 19*(trvIdx-1)+6;
        ret.size = 6;
        return ret;
    }

    return IndexRange::InvalidRange();
}